

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O1

bool __thiscall libtorrent::aux::piece_picker::is_requested(piece_picker *this,piece_block block)

{
  uint uVar1;
  int iVar2;
  download_queue_t queue;
  iterator iVar3;
  int iVar4;
  bool bVar5;
  
  uVar1 = *(uint *)((this->m_piece_map).
                    super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                    .
                    super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                    ._M_impl.super__Vector_impl_data._M_start + block.piece_index.m_val.m_val);
  queue.m_val = (byte)(uVar1 >> 0x1a) & 7;
  if (queue.m_val == 5) {
    queue.m_val = '\0';
  }
  else if ((uVar1 >> 0x1a & 7) == 6) {
    queue.m_val = '\x01';
  }
  if (queue.m_val == '\x04') {
    bVar5 = false;
  }
  else {
    iVar3 = find_dl_piece(this,queue,block.piece_index.m_val);
    iVar2 = this->m_piece_size;
    iVar4 = 0x4000;
    if (iVar2 < 0x4000) {
      iVar4 = iVar2;
    }
    bVar5 = (*(ushort *)
              &(this->m_block_info).
               super_vector<libtorrent::aux::piece_picker::block_info,_std::allocator<libtorrent::aux::piece_picker::block_info>_>
               .
               super__Vector_base<libtorrent::aux::piece_picker::block_info,_std::allocator<libtorrent::aux::piece_picker::block_info>_>
               ._M_impl.super__Vector_impl_data._M_start
               [(long)((iVar2 + iVar4 + -1) / iVar4) * (ulong)(iVar3._M_current)->info_idx +
                ((long)block >> 0x20)].field_0x8 & 0xc000) == 0x4000;
  }
  return bVar5;
}

Assistant:

bool piece_picker::is_requested(piece_block const block) const
	{
		TORRENT_ASSERT(block.block_index != piece_block::invalid.block_index);
		TORRENT_ASSERT(block.piece_index != piece_block::invalid.piece_index);
		TORRENT_ASSERT(block.piece_index < m_piece_map.end_index());

		auto const state = m_piece_map[block.piece_index].download_queue();
		if (state == piece_pos::piece_open) return false;
		auto const i = find_dl_piece(state, block.piece_index);

		TORRENT_ASSERT(i != m_downloads[state].end());

		auto const info = blocks_for_piece(*i);
		TORRENT_ASSERT(info[block.block_index].piece_index == block.piece_index);
		return info[block.block_index].state == block_info::state_requested;
	}